

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O1

void __thiscall
sf::priv::GlxContext::createSurface
          (GlxContext *this,GlxContext *shared,uint width,uint height,uint bitsPerPixel)

{
  Display *pDVar1;
  GLXFBConfig *pp_Var2;
  XVisualInfo *pXVar3;
  GLXPbuffer GVar4;
  Window WVar5;
  GLXFBConfig *pp_Var6;
  long lVar7;
  long lVar8;
  GLXFBConfig *pp_Var9;
  bool bVar10;
  int nbConfigs;
  int minor;
  int major;
  XVisualInfo visualInfo;
  XSetWindowAttributes attributes;
  
  selectBestVisual(&visualInfo,this->m_display,bitsPerPixel,&(this->super_GlContext).m_settings);
  if ((shared == (GlxContext *)0x0) || (SF_GLAD_GLX_SGIX_pbuffer == 0)) goto LAB_00192e3c;
  major = 0;
  minor = 0;
  (*sf_glad_glXQueryVersion)(this->m_display,&major,&minor);
  if ((major < 2) && (minor < 3)) goto LAB_00192e3c;
  nbConfigs = 0;
  pp_Var6 = (GLXFBConfig *)0x0;
  pp_Var2 = (*sf_glad_glXChooseFBConfig)
                      (this->m_display,*(int *)(this->m_display + 0xe0),(int *)0x0,&nbConfigs);
  if ((pp_Var2 != (GLXFBConfig *)0x0) && (0 < nbConfigs)) {
    pp_Var6 = (GLXFBConfig *)0x0;
    lVar7 = 1;
    pp_Var9 = pp_Var2;
    do {
      pXVar3 = (*sf_glad_glXGetVisualFromFBConfig)(this->m_display,*pp_Var9);
      if (pXVar3 == (XVisualInfo *)0x0) {
        bVar10 = false;
      }
      else {
        bVar10 = pXVar3->visualid == visualInfo.visualid;
        if (bVar10) {
          pp_Var6 = pp_Var9;
        }
        XFree(pXVar3);
      }
      if ((bVar10) || (pp_Var2 == (GLXFBConfig *)0x0)) break;
      pp_Var9 = pp_Var9 + 1;
      bVar10 = lVar7 < nbConfigs;
      lVar7 = lVar7 + 1;
    } while (bVar10);
  }
  if (pp_Var6 == (GLXFBConfig *)0x0) {
    if (pp_Var2 != (GLXFBConfig *)0x0) goto LAB_00192e2b;
  }
  else {
    attributes.background_pixmap._0_4_ = 0x8041;
    attributes.background_pixel._0_4_ = 0x8040;
    attributes.border_pixmap = 0;
    attributes.background_pixmap._4_4_ = width;
    attributes.background_pixel._4_4_ = height;
    GVar4 = (*sf_glad_glXCreatePbuffer)(this->m_display,*pp_Var6);
    this->m_pbuffer = GVar4;
    updateSettingsFromVisualInfo(this,&visualInfo);
LAB_00192e2b:
    XFree(pp_Var2);
  }
  if (pp_Var6 != (GLXFBConfig *)0x0) {
    return;
  }
LAB_00192e3c:
  pDVar1 = this->m_display;
  lVar8 = (long)*(int *)(pDVar1 + 0xe0) * 0x80;
  attributes.colormap =
       XCreateColormap(pDVar1,*(undefined8 *)(*(long *)(pDVar1 + 0xe8) + 0x10 + lVar8),
                       visualInfo.visual,0);
  lVar7 = *(long *)(this->m_display + 0xe8);
  WVar5 = XCreateWindow(this->m_display,*(undefined8 *)(lVar7 + 0x10 + lVar8),0,0,width,height,0,
                        *(undefined4 *)(lVar7 + 0x38 + lVar8),1,visualInfo.visual,0x2000,&attributes
                       );
  this->m_window = WVar5;
  this->m_ownsWindow = true;
  updateSettingsFromWindow(this);
  return;
}

Assistant:

void GlxContext::createSurface(GlxContext* shared, unsigned int width, unsigned int height, unsigned int bitsPerPixel)
{
    // Choose the visual according to the context settings
    XVisualInfo visualInfo = selectBestVisual(m_display, bitsPerPixel, m_settings);

    // Check if the shared context already exists and pbuffers are supported
    if (shared && SF_GLAD_GLX_SGIX_pbuffer)
    {
        // There are no GLX versions prior to 1.0
        int major = 0;
        int minor = 0;

        glXQueryVersion(m_display, &major, &minor);

        // Check if glXCreatePbuffer is available (requires GLX 1.3 or greater)
        bool hasCreatePbuffer = ((major > 1) || (minor >= 3));

        if (hasCreatePbuffer)
        {
            // Get a GLXFBConfig that matches the visual
            GLXFBConfig* config = NULL;

            // We don't supply attributes to match against, since
            // the visual we are matching against was already
            // deemed suitable in selectBestVisual()
            int nbConfigs = 0;
            GLXFBConfig* configs = glXChooseFBConfig(m_display, DefaultScreen(m_display), NULL, &nbConfigs);

            for (int i = 0; configs && (i < nbConfigs); ++i)
            {
                XVisualInfo* visual = glXGetVisualFromFBConfig(m_display, configs[i]);

                if (!visual)
                    continue;

                if (visual->visualid == visualInfo.visualid)
                {
                    config = &configs[i];
                    XFree(visual);
                    break;
                }

                XFree(visual);
            }

            if (config)
            {
                int attributes[] =
                {
                    GLX_PBUFFER_WIDTH,  static_cast<int>(width),
                    GLX_PBUFFER_HEIGHT, static_cast<int>(height),
                    0,                  0
                };

                m_pbuffer = glXCreatePbuffer(m_display, *config, attributes);

                updateSettingsFromVisualInfo(&visualInfo);

                XFree(configs);

                return;
            }

            if (configs)
                XFree(configs);
        }
    }

    // If pbuffers are not available we use a hidden window as the off-screen surface to draw to
    int screen = DefaultScreen(m_display);

    // Define the window attributes
    XSetWindowAttributes attributes;
    attributes.colormap = XCreateColormap(m_display, RootWindow(m_display, screen), visualInfo.visual, AllocNone);

    // Note: bitsPerPixel is explicitly ignored. Instead, DefaultDepth() is used in order to avoid window creation failure due to
    // a depth not supported by the X window system. On Unix/Linux, the window's pixel format is not directly associated with the
    // rendering surface (unlike on Windows, for example).
    m_window = XCreateWindow(m_display,
                             RootWindow(m_display, screen),
                             0, 0,
                             width, height,
                             0,
                             DefaultDepth(m_display, screen),
                             InputOutput,
                             visualInfo.visual,
                             CWColormap,
                             &attributes);

    m_ownsWindow = true;

    updateSettingsFromWindow();
}